

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlimits.c
# Opt level: O0

int readerTest(char *filename,size_t limit,int options,int fail)

{
  int iVar1;
  long lVar2;
  int local_38;
  int local_34;
  int ret;
  int res;
  xmlTextReaderPtr reader;
  int fail_local;
  int options_local;
  size_t limit_local;
  char *filename_local;
  
  nb_tests = nb_tests + 1;
  maxlen = limit;
  lVar2 = xmlReaderForFile(filename,0,options);
  if (lVar2 == 0) {
    fprintf(_stderr,"Failed to open \'%s\' test\n",filename);
    filename_local._4_4_ = 1;
  }
  else {
    local_38 = xmlTextReaderRead(lVar2);
    while (local_38 == 1) {
      local_38 = xmlTextReaderRead(lVar2);
    }
    if (local_38 == 0) {
      if (fail == 0) {
        local_34 = 0;
      }
      else {
        iVar1 = strncmp(filename,"crazy:",6);
        if (iVar1 == 0) {
          fprintf(_stderr,"Failed to get failure for \'%s\' %u\n",filename,(ulong)crazy_indx);
        }
        else {
          fprintf(_stderr,"Failed to get failure for \'%s\' %lu\n",filename,limit);
        }
        local_34 = 1;
      }
    }
    else if (fail == 0) {
      iVar1 = strncmp(filename,"crazy:",6);
      if (iVar1 == 0) {
        fprintf(_stderr,"Failed to parse \'%s\' %u\n",filename,(ulong)crazy_indx);
      }
      else {
        fprintf(_stderr,"Failed to parse \'%s\' %lu\n",filename,limit);
      }
      local_34 = 1;
    }
    else {
      local_34 = 0;
    }
    if (timeout != 0) {
      local_34 = 1;
    }
    xmlFreeTextReader(lVar2);
    filename_local._4_4_ = local_34;
  }
  return filename_local._4_4_;
}

Assistant:

static int
readerTest(const char *filename, size_t limit, int options, int fail) {
    xmlTextReaderPtr reader;
    int res = 0;
    int ret;

    nb_tests++;

    maxlen = limit;
    reader = xmlReaderForFile(filename , NULL, options);
    if (reader == NULL) {
        fprintf(stderr, "Failed to open '%s' test\n", filename);
	return(1);
    }
    ret = xmlTextReaderRead(reader);
    while (ret == 1) {
        ret = xmlTextReaderRead(reader);
    }
    if (ret != 0) {
        if (fail)
            res = 0;
        else {
            if (strncmp(filename, "crazy:", 6) == 0)
                fprintf(stderr, "Failed to parse '%s' %u\n",
                        filename, crazy_indx);
            else
                fprintf(stderr, "Failed to parse '%s' %lu\n",
                        filename, (unsigned long) limit);
            res = 1;
        }
    } else {
        if (fail) {
            if (strncmp(filename, "crazy:", 6) == 0)
                fprintf(stderr, "Failed to get failure for '%s' %u\n",
                        filename, crazy_indx);
            else
                fprintf(stderr, "Failed to get failure for '%s' %lu\n",
                        filename, (unsigned long) limit);
            res = 1;
        } else
            res = 0;
    }
    if (timeout)
        res = 1;
    xmlFreeTextReader(reader);

    return(res);
}